

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_test.c
# Opt level: O2

void redtest(char *ifname,char *ifname2)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  short sVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ushort *puVar14;
  uint uVar15;
  
  puts("Starting Redundant test");
  iVar6 = ec_init_redundant(ifname,ifname2);
  if (iVar6 != 0) {
    printf("ec_init on %s succeeded.\n",ifname);
    iVar6 = ec_config(0,IOmap);
    if (iVar6 < 1) {
      puts("No slaves found!");
    }
    else {
      printf("%d slaves found and configured.\n",(ulong)_ec_slavecount);
      ec_statecheck(0,4,2000000);
      ec_configdc();
      ec_readstate();
      lVar9 = 0x107350;
      for (uVar13 = 1; (long)uVar13 <= (long)(int)_ec_slavecount; uVar13 = uVar13 + 1) {
        printf("Slave:%d Name:%s Output size:%3dbits Input size:%3dbits State:%2d delay:%d.%d\n",
               uVar13 & 0xffffffff,lVar9,(ulong)*(ushort *)(lVar9 + -0x100),
               (ulong)*(ushort *)(lVar9 + -0xee),(ulong)*(ushort *)(lVar9 + -0x118),
               (ulong)*(uint *)(lVar9 + -0x2c),(ulong)*(byte *)(lVar9 + -0x47));
        printf("         Out:%8.8x,%4d In:%8.8x,%4d\n",*(undefined8 *)(lVar9 + -0xf8),
               (ulong)*(uint *)(lVar9 + -0xfc),*(undefined8 *)(lVar9 + -0xe8),
               (ulong)*(uint *)(lVar9 + -0xec));
        if ((digout == (uint8 *)0x0) &&
           ((*(int *)(lVar9 + -0x10c) == 0xaf83052 || (*(int *)(lVar9 + -0x10c) == 0x7d83052)))) {
          digout = *(uint8 **)(lVar9 + -0xf8);
        }
        lVar9 = lVar9 + 0x148;
      }
      expectedWKC = (uint)_DAT_00107118 + (uint)_DAT_00107116 * 2;
      printf("Calculated workcounter %d\n");
      puts("Request operational state for all slaves");
      _ec_slave = 8;
      ec_writestate(0);
      dorun = 1;
      ec_statecheck(0,8,2000000);
      uVar5 = _DAT_0010711c;
      sVar4 = _DAT_0010711a;
      uVar7 = _DAT_0010710c;
      sVar3 = ___cxa_finalize;
      if (_ec_slave == 8) {
        uVar15 = 8;
        if ((int)_DAT_0010711c < 8) {
          uVar15 = _DAT_0010711c;
        }
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        uVar12 = 8;
        if ((int)_DAT_0010710c < 8) {
          uVar12 = _DAT_0010710c;
        }
        uVar13 = (ulong)uVar12;
        if ((int)uVar12 < 1) {
          uVar13 = 0;
        }
        puts("Operational state reached for all slaves.");
        uVar10 = uVar13;
        if (sVar3 != 0) {
          uVar10 = 1;
        }
        if (uVar7 != 0) {
          uVar10 = uVar13;
        }
        uVar13 = 1;
        if (sVar4 == 0) {
          uVar13 = (ulong)uVar15;
        }
        if (uVar5 != 0) {
          uVar13 = (ulong)uVar15;
        }
        inOP = '\x01';
        for (iVar6 = 1; iVar6 != 0x1389; iVar6 = iVar6 + 1) {
          printf("Processdata cycle %5d , Wck %3d, DCtime %12lld, dt %12lld, O:",(ulong)(uint)dorun,
                 (ulong)(uint)wkc,_ec_DCtime,gl_delta);
          for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
            printf(" %2.2x",(ulong)*(byte *)(CONCAT26(_DAT_00107116,_DAT_00107110) + uVar11));
          }
          printf(" I:");
          for (uVar11 = 0; uVar13 != uVar11; uVar11 = uVar11 + 1) {
            printf(" %2.2x",(ulong)*(byte *)(_DAT_00107120 + uVar11));
          }
          putchar(0xd);
          fflush(_stdout);
          osal_usleep(20000);
        }
        dorun = 0;
        inOP = '\0';
      }
      else {
        puts("Not all slaves reached operational state.");
        ec_readstate();
        puVar14 = (ushort *)&DAT_0010723a;
        uVar7 = _ec_slavecount;
        for (uVar13 = 1; (long)uVar13 <= (long)(int)uVar7; uVar13 = uVar13 + 1) {
          uVar1 = puVar14[-1];
          if (uVar1 != 8) {
            uVar2 = *puVar14;
            uVar8 = ec_ALstatuscode2string(uVar2);
            printf("Slave %d State=0x%2.2x StatusCode=0x%4.4x : %s\n",uVar13 & 0xffffffff,
                   (ulong)(uint)uVar1,(ulong)uVar2,uVar8);
            uVar7 = _ec_slavecount;
          }
          puVar14 = puVar14 + 0xa4;
        }
      }
      puts("Request safe operational state for all slaves");
      _ec_slave = 4;
      ec_writestate(0);
    }
    puts("End redundant test, close socket");
    ec_close();
    return;
  }
  printf("No socket connection on %s\nExcecute as root\n",ifname);
  return;
}

Assistant:

void redtest(char *ifname, char *ifname2)
{
   int cnt, i, j, oloop, iloop;
   
   printf("Starting Redundant test\n");
   
   /* initialise SOEM, bind socket to ifname */
   if (ec_init_redundant(ifname, ifname2))
   {   
      printf("ec_init on %s succeeded.\n",ifname);
      /* find and auto-config slaves */
      if ( ec_config(FALSE, &IOmap) > 0 )
      {
         printf("%d slaves found and configured.\n",ec_slavecount);
         /* wait for all slaves to reach SAFE_OP state */
         ec_statecheck(0, EC_STATE_SAFE_OP,  EC_TIMEOUTSTATE);
         
         /* configure DC options for every DC capable slave found in the list */
         ec_configdc();
                  
         /* read indevidual slave state and store in ec_slave[] */
         ec_readstate();
         for(cnt = 1; cnt <= ec_slavecount ; cnt++)
         {
            printf("Slave:%d Name:%s Output size:%3dbits Input size:%3dbits State:%2d delay:%d.%d\n",
                  cnt, ec_slave[cnt].name, ec_slave[cnt].Obits, ec_slave[cnt].Ibits,
                  ec_slave[cnt].state, (int)ec_slave[cnt].pdelay, ec_slave[cnt].hasdc);
            printf("         Out:%8.8x,%4d In:%8.8x,%4d\n",
                  (intptr_t)ec_slave[cnt].outputs, ec_slave[cnt].Obytes, (intptr_t)ec_slave[cnt].inputs, ec_slave[cnt].Ibytes);
            /* check for EL2004 or EL2008 */
            if( !digout && ((ec_slave[cnt].eep_id == 0x0af83052) || (ec_slave[cnt].eep_id == 0x07d83052)))
            {
               digout = ec_slave[cnt].outputs;
            }   
         }
         expectedWKC = (ec_group[0].outputsWKC * 2) + ec_group[0].inputsWKC;
         printf("Calculated workcounter %d\n", expectedWKC);

         printf("Request operational state for all slaves\n");
         ec_slave[0].state = EC_STATE_OPERATIONAL;
         /* request OP state for all slaves */
         ec_writestate(0);
         /* activate cyclic process data */
         dorun = 1;
         /* wait for all slaves to reach OP state */
         ec_statecheck(0, EC_STATE_OPERATIONAL,  EC_TIMEOUTSTATE);
         oloop = ec_slave[0].Obytes;
         if ((oloop == 0) && (ec_slave[0].Obits > 0)) oloop = 1;
         if (oloop > 8) oloop = 8;
         iloop = ec_slave[0].Ibytes;
         if ((iloop == 0) && (ec_slave[0].Ibits > 0)) iloop = 1;
         if (iloop > 8) iloop = 8;
         if (ec_slave[0].state == EC_STATE_OPERATIONAL )
         {
            printf("Operational state reached for all slaves.\n");
            inOP = TRUE;
            /* acyclic loop 5000 x 20ms = 10s */
            for(i = 1; i <= 5000; i++)
            {
               printf("Processdata cycle %5d , Wck %3d, DCtime %12lld, dt %12lld, O:",
                  dorun, wkc , ec_DCtime, gl_delta);
               for(j = 0 ; j < oloop; j++)
               {
                  printf(" %2.2x", *(ec_slave[0].outputs + j));
               }
               printf(" I:");
               for(j = 0 ; j < iloop; j++)
               {
                  printf(" %2.2x", *(ec_slave[0].inputs + j));
               }   
               printf("\r");
               fflush(stdout);
               osal_usleep(20000);
            }
            dorun = 0;
            inOP = FALSE;
         }
         else
         {
            printf("Not all slaves reached operational state.\n");
             ec_readstate();
             for(i = 1; i<=ec_slavecount ; i++)
             {
                 if(ec_slave[i].state != EC_STATE_OPERATIONAL)
                 {
                     printf("Slave %d State=0x%2.2x StatusCode=0x%4.4x : %s\n",
                         i, ec_slave[i].state, ec_slave[i].ALstatuscode, ec_ALstatuscode2string(ec_slave[i].ALstatuscode));
                 }
             }
         }         
         printf("Request safe operational state for all slaves\n");
         ec_slave[0].state = EC_STATE_SAFE_OP;
         /* request SAFE_OP state for all slaves */
         ec_writestate(0);
      }
      else
      {
         printf("No slaves found!\n");
      }
      printf("End redundant test, close socket\n");
      /* stop SOEM, close socket */
      ec_close();
   }
   else
   {
      printf("No socket connection on %s\nExcecute as root\n",ifname);
   }   
}